

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::addData
          (string *__return_storage_ptr__,VRDataIndex *this,string *key,VRString *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)key);
  std::__cxx11::string::string((string *)&bStack_58,(string *)value);
  addDataSpecialized<std::__cxx11::string,(MinVR::VRCORETYPE_ID)3>
            (__return_storage_ptr__,this,&local_38,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VRDataIndex::addData(const std::string &key, VRString value) {

  return addDataSpecialized<VRString, VRCORETYPE_STRING>(key, value);
}